

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Qentem::Array<Qentem::Value<char>_>::Reset(Array<Qentem::Value<char>_> *this)

{
  Value<char> *pVVar1;
  Value<char> *end;
  Array<Qentem::Value<char>_> *this_local;
  
  pVVar1 = Storage(this);
  end = End(this);
  Memory::Dispose<Qentem::Value<char>>(pVVar1,end);
  pVVar1 = Storage(this);
  Memory::Deallocate(pVVar1);
  clearStorage(this);
  setSize(this,0);
  setCapacity(this,0);
  return;
}

Assistant:

void Reset() noexcept {
        Memory::Dispose(Storage(), End());
        Memory::Deallocate(Storage());

        clearStorage();
        setSize(0);
        setCapacity(0);
    }